

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void store_helper(CPUArchState_conflict28 *env,target_ulong_conflict addr,uint64_t val,
                 TCGMemOpIdx oi,uintptr_t retaddr,MemOp op)

{
  int iVar1;
  uc_struct *uc_00;
  _Bool _Var2;
  byte bVar3;
  uint mmu_idx_00;
  MemOp memop;
  uint uVar4;
  uint size_00;
  target_ulong_conflict tVar5;
  ulong mmu_idx_01;
  ulong len;
  CPUState *pCVar6;
  MemoryRegion_conflict *pMVar7;
  CPUIOTLBEntry *iotlbentry_00;
  void *haddr_00;
  ulong len_00;
  CPUTLB_conflict5 *pCVar8;
  bool bVar9;
  bool local_d9;
  uint8_t local_d5;
  uint8_t val8;
  int old_size;
  size_t size2;
  target_ulong_conflict tlb_addr2;
  target_ulong_conflict page2;
  CPUTLBEntry *entry2;
  uintptr_t index2;
  int i;
  _Bool need_swap;
  CPUIOTLBEntry *iotlbentry;
  MemoryRegion_conflict *mr;
  long lStack_90;
  _Bool handled;
  hook *hook;
  size_t size;
  void *haddr;
  uint a_bits;
  size_t tlb_off;
  target_ulong_conflict paddr;
  target_ulong_conflict tlb_addr;
  CPUTLBEntry *entry;
  uintptr_t index;
  uintptr_t mmu_idx;
  list_item *cur;
  uc_struct_conflict15 *uc;
  MemOp op_local;
  uintptr_t retaddr_local;
  TCGMemOpIdx oi_local;
  uint64_t val_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict28 *env_local;
  
  uc_00 = (uc_struct *)env->uc;
  mmu_idx_00 = get_mmuidx(oi);
  mmu_idx_01 = (ulong)mmu_idx_00;
  entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
  _paddr = tlb_entry(env,mmu_idx_01,addr);
  tlb_off._4_4_ = tlb_addr_write(_paddr);
  memop = get_memop(oi);
  uVar4 = get_alignment_bits(memop);
  size_00 = memop_size(op);
  len = (ulong)size_00;
  if ((addr & (1 << ((byte)uVar4 & 0x1f)) - 1U) != 0) {
    pCVar6 = env_cpu(env);
    cpu_unaligned_access(pCVar6,(ulong)addr,MMU_DATA_STORE,mmu_idx_00,retaddr);
  }
  _Var2 = tlb_hit(env->uc,tlb_off._4_4_,addr);
  if (!_Var2) {
    _Var2 = victim_tlb_hit(env,mmu_idx_01,(size_t)entry,4,addr & 0xffffc000);
    if (!_Var2) {
      pCVar6 = env_cpu(env);
      tlb_fill(pCVar6,addr,size_00,MMU_DATA_STORE,mmu_idx_00,retaddr);
      entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
      _paddr = tlb_entry(env,mmu_idx_01,addr);
    }
    tVar5 = tlb_addr_write(_paddr);
    tlb_off._4_4_ = tVar5 & 0xffffdfff;
  }
  tlb_off._0_4_ = *(uint *)((long)&_paddr->field_0 + 0xc) | addr & 0x3fff;
  iotlbentry = (CPUIOTLBEntry *)(*uc_00->memory_mapping)(uc_00,(hwaddr)(uint)tlb_off);
  if (uc_00->size_recur_mem == 0) {
    mmu_idx = (uintptr_t)uc_00->hook[0xb].head;
    while( true ) {
      bVar9 = false;
      if (mmu_idx != 0) {
        lStack_90 = *(long *)(mmu_idx + 8);
        bVar9 = lStack_90 != 0;
      }
      if ((!bVar9) ||
         (((*(byte *)(lStack_90 + 0x14) & 1) == 0 &&
          ((((*(ulong *)(lStack_90 + 0x18) <= (ulong)(uint)tlb_off &&
             ((ulong)(uint)tlb_off <= *(ulong *)(lStack_90 + 0x20))) ||
            (*(ulong *)(lStack_90 + 0x20) < *(ulong *)(lStack_90 + 0x18))) &&
           (((*(byte *)(lStack_90 + 0x14) & 1) == 0 &&
            ((**(code **)(lStack_90 + 0x28))
                       (uc_00,0x11,(uint)tlb_off,len,val,*(undefined8 *)(lStack_90 + 0x30)),
            (uc_00->stop_request & 1U) != 0)))))))) break;
      mmu_idx = *(uintptr_t *)mmu_idx;
    }
  }
  if ((MemoryRegion *)iotlbentry == (MemoryRegion *)0x0) {
    mr._7_1_ = 0;
    mmu_idx = (uintptr_t)uc_00->hook[5].head;
    while( true ) {
      bVar9 = false;
      if (mmu_idx != 0) {
        lStack_90 = *(long *)(mmu_idx + 8);
        bVar9 = lStack_90 != 0;
      }
      if (!bVar9) break;
      if ((((*(byte *)(lStack_90 + 0x14) & 1) == 0) &&
          (((*(ulong *)(lStack_90 + 0x18) <= (ulong)(uint)tlb_off &&
            ((ulong)(uint)tlb_off <= *(ulong *)(lStack_90 + 0x20))) ||
           (*(ulong *)(lStack_90 + 0x20) < *(ulong *)(lStack_90 + 0x18))))) &&
         ((*(byte *)(lStack_90 + 0x14) & 1) == 0)) {
        bVar3 = (**(code **)(lStack_90 + 0x28))
                          (uc_00,0x14,(uint)tlb_off,len,val,*(undefined8 *)(lStack_90 + 0x30));
        mr._7_1_ = bVar3 & 1;
        if (((bVar3 & 1) != 0) || ((uc_00->stop_request & 1U) != 0)) break;
      }
      mmu_idx = *(uintptr_t *)mmu_idx;
    }
    if (mr._7_1_ == 0) {
      uc_00->invalid_addr = (ulong)(uint)tlb_off;
      uc_00->invalid_error = 7;
      cpu_exit(uc_00->cpu);
      return;
    }
    uc_00->invalid_error = 0;
    _Var2 = tlb_hit(env->uc,tlb_off._4_4_,addr);
    if (!_Var2) {
      _Var2 = victim_tlb_hit(env,mmu_idx_01,(size_t)entry,4,addr & 0xffffc000);
      if (!_Var2) {
        pCVar6 = env_cpu(env);
        tlb_fill(pCVar6,addr,size_00,MMU_DATA_STORE,mmu_idx_00,retaddr);
        entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
        _paddr = tlb_entry(env,mmu_idx_01,addr);
      }
      tVar5 = tlb_addr_write(_paddr);
      tlb_off._4_4_ = tVar5 & 0xffffdfff;
    }
    tlb_off._0_4_ = *(uint *)((long)&_paddr->field_0 + 0xc) | addr & 0x3fff;
    iotlbentry = (CPUIOTLBEntry *)(*uc_00->memory_mapping)(uc_00,(hwaddr)(uint)tlb_off);
    if ((MemoryRegion *)iotlbentry == (MemoryRegion *)0x0) {
      uc_00->invalid_error = 0xb;
      cpu_exit(uc_00->cpu);
      return;
    }
  }
  if ((iotlbentry != (CPUIOTLBEntry *)0x0) && (((uint)iotlbentry[8].attrs & 2) == 0)) {
    mr._7_1_ = 0;
    mmu_idx = (uintptr_t)uc_00->hook[8].head;
    while( true ) {
      bVar9 = false;
      if (mmu_idx != 0) {
        lStack_90 = *(long *)(mmu_idx + 8);
        bVar9 = lStack_90 != 0;
      }
      if (!bVar9) break;
      if ((((*(byte *)(lStack_90 + 0x14) & 1) == 0) &&
          (((*(ulong *)(lStack_90 + 0x18) <= (ulong)(uint)tlb_off &&
            ((ulong)(uint)tlb_off <= *(ulong *)(lStack_90 + 0x20))) ||
           (*(ulong *)(lStack_90 + 0x20) < *(ulong *)(lStack_90 + 0x18))))) &&
         ((*(byte *)(lStack_90 + 0x14) & 1) == 0)) {
        bVar3 = (**(code **)(lStack_90 + 0x28))
                          (uc_00,0x16,(uint)tlb_off,len,val,*(undefined8 *)(lStack_90 + 0x30));
        mr._7_1_ = bVar3 & 1;
        if (((bVar3 & 1) != 0) || ((uc_00->stop_request & 1U) != 0)) break;
      }
      mmu_idx = *(uintptr_t *)mmu_idx;
    }
    if (mr._7_1_ == 0) {
      uc_00->invalid_addr = (ulong)(uint)tlb_off;
      uc_00->invalid_error = 0xc;
      cpu_exit(uc_00->cpu);
      return;
    }
    _Var2 = tlb_hit(env->uc,tlb_off._4_4_,addr);
    if (!_Var2) {
      _Var2 = victim_tlb_hit(env,mmu_idx_01,(size_t)entry,4,addr & 0xffffc000);
      if (!_Var2) {
        pCVar6 = env_cpu(env);
        tlb_fill(pCVar6,addr,size_00,MMU_DATA_STORE,mmu_idx_00,retaddr);
        entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
        _paddr = tlb_entry(env,mmu_idx_01,addr);
      }
      tVar5 = tlb_addr_write(_paddr);
      tlb_off._4_4_ = tVar5 & 0xffffdfff;
    }
    uc_00->invalid_error = 0;
  }
  if (((uc_00->snapshot_level != 0) && ((iotlbentry->addr & 1) != 0)) &&
     (*(int *)&iotlbentry[5].field_0xc < uc_00->snapshot_level)) {
    pMVar7 = memory_cow_tricore((uc_struct_conflict15 *)uc_00,(MemoryRegion_conflict *)iotlbentry,
                                (ulong)(addr & 0xffffc000),0x4000);
    if (pMVar7 == (MemoryRegion_conflict *)0x0) {
      uc_00->invalid_addr = (ulong)(uint)tlb_off;
      uc_00->invalid_error = 1;
      cpu_exit(uc_00->cpu);
      return;
    }
    pCVar6 = env_cpu(env);
    tlb_fill(pCVar6,(uint)tlb_off,size_00,MMU_DATA_STORE,mmu_idx_00,retaddr);
    entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
    _paddr = tlb_entry(env,mmu_idx_01,addr);
    tlb_off._4_4_ = tlb_addr_write(_paddr);
  }
  if ((tlb_off._4_4_ & 0x3fff) == 0) {
    if ((len < 2) || (((addr & 0x3fff) + len) - 1 < 0x4000)) {
      store_memop((void *)((ulong)addr + *(long *)((long)&_paddr->field_0 + 0x10)),val,op);
      return;
    }
  }
  else if (((ulong)addr & len - 1) == 0) {
    pCVar8 = env_tlb(env);
    iotlbentry_00 = pCVar8->d[mmu_idx_01].iotlb + (long)entry;
    if ((tlb_off._4_4_ & 0x400) != 0) {
      pCVar6 = env_cpu(env);
      cpu_check_watchpoint_tricore(pCVar6,(ulong)addr,len,iotlbentry_00->attrs,2,retaddr);
    }
    bVar9 = (tlb_off._4_4_ & 0x200) != 0;
    local_d9 = 1 < len && bVar9;
    if ((tlb_off._4_4_ & 0x800) != 0) {
      io_writex(env,iotlbentry_00,mmu_idx_00,val,addr,retaddr,op ^ (uint)local_d9 << 3);
      return;
    }
    if ((tlb_off._4_4_ & 0x100) != 0) {
      return;
    }
    if ((tlb_off._4_4_ & 0x1000) != 0) {
      pCVar6 = env_cpu(env);
      notdirty_write(pCVar6,(ulong)addr,size_00,iotlbentry_00,retaddr);
    }
    haddr_00 = (void *)((ulong)addr + *(long *)((long)&_paddr->field_0 + 0x10));
    if (1 < len && bVar9) {
      store_memop(haddr_00,val,op ^ MO_BE);
      return;
    }
    store_memop(haddr_00,val,op);
    return;
  }
  uVar4 = addr + size_00 & 0xffffc000;
  len_00 = addr + len & 0x3fff;
  entry2 = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,uVar4);
  _tlb_addr2 = tlb_entry(env,mmu_idx_01,uVar4);
  size2._0_4_ = tlb_addr_write(_tlb_addr2);
  _Var2 = tlb_hit_page((uc_struct_conflict15 *)uc_00,(target_ulong_conflict)size2,uVar4);
  if (!_Var2) {
    _Var2 = victim_tlb_hit(env,mmu_idx_01,(size_t)entry2,4,uVar4);
    if (!_Var2) {
      pCVar6 = env_cpu(env);
      tlb_fill(pCVar6,uVar4,(int)len_00,MMU_DATA_STORE,mmu_idx_00,retaddr);
      entry2 = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,uVar4);
      _tlb_addr2 = tlb_entry(env,mmu_idx_01,uVar4);
    }
    size2._0_4_ = tlb_addr_write(_tlb_addr2);
  }
  if ((tlb_off._4_4_ & 0x400) != 0) {
    pCVar6 = env_cpu(env);
    pCVar8 = env_tlb(env);
    cpu_check_watchpoint_tricore
              (pCVar6,(ulong)addr,len - len_00,pCVar8->d[mmu_idx_01].iotlb[(long)entry].attrs,2,
               retaddr);
  }
  if (((target_ulong_conflict)size2 & 0x400) != 0) {
    pCVar6 = env_cpu(env);
    pCVar8 = env_tlb(env);
    cpu_check_watchpoint_tricore
              (pCVar6,(ulong)uVar4,len_00,pCVar8->d[mmu_idx_01].iotlb[(long)entry2].attrs,2,retaddr)
    ;
  }
  iVar1 = uc_00->size_recur_mem;
  uc_00->size_recur_mem = size_00;
  for (index2._0_4_ = 0; (ulong)(long)(int)index2 < len; index2._0_4_ = (int)index2 + 1) {
    _Var2 = memop_big_endian(op);
    if (_Var2) {
      local_d5 = (uint8_t)(val >> (((char)size_00 + -1) * '\b' - (char)((int)index2 << 3) & 0x3fU));
    }
    else {
      local_d5 = (uint8_t)(val >> ((byte)((int)index2 << 3) & 0x3f));
    }
    helper_ret_stb_mmu_tricore(env,addr + (int)index2,local_d5,oi,retaddr);
  }
  uc_00->size_recur_mem = iVar1;
  return;
}

Assistant:

static void inline
store_helper(CPUArchState *env, target_ulong addr, uint64_t val,
             TCGMemOpIdx oi, uintptr_t retaddr, MemOp op)
{
    struct uc_struct *uc = env->uc;
    HOOK_FOREACH_VAR_DECLARE;
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = tlb_addr_write(entry);
    target_ulong paddr;
    const size_t tlb_off = offsetof(CPUTLBEntry, addr_write);
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    size_t size = memop_size(op);
    struct hook *hook;
    bool handled;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, MMU_DATA_STORE,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                     mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
    }

    // Load the latest memory mapping.
    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    if (!uc->size_recur_mem) { // disabling write callback if in recursive call
        // Unicorn: callback on memory write
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(uc, UC_MEM_WRITE, paddr, size, val, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }
    }

    // Unicorn: callback on invalid memory
    if (mr == NULL) {
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_UNMAPPED) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_UNMAPPED, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (!handled) {
            // save error & quit
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_UNMAPPED;
            // printf("***** Invalid memory write at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        } else {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                cpu_exit(uc->cpu);
                return;
            }
        }
    }

    // Unicorn: callback on non-writable memory
    if (mr != NULL && !(mr->perms & UC_PROT_WRITE)) {  //non-writable
        // printf("not writable memory???\n");
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_PROT) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_PROT, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (handled) {
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            uc->invalid_error = UC_ERR_OK;
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_PROT;
            // printf("***** Invalid memory write (ro) at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        }
    }

    if (uc->snapshot_level && mr->ram && mr->priority < uc->snapshot_level) {
        mr = memory_cow(uc, mr, addr & TARGET_PAGE_MASK, TARGET_PAGE_SIZE);
        if (!mr) {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_NOMEM;
            cpu_exit(uc->cpu);
            return;
        }
        /* refill tlb after CoW */
        tlb_fill(env_cpu(env), paddr, size, MMU_DATA_STORE,
                 mmu_idx, retaddr);
        index = tlb_index(env, mmu_idx, addr);
        entry = tlb_entry(env, mmu_idx, addr);
        tlb_addr = tlb_addr_write(entry);
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through byte stores.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_WRITE, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (tlb_addr & TLB_MMIO) {
            io_writex(env, iotlbentry, mmu_idx, val, addr, retaddr,
                      op ^ (need_swap * MO_BSWAP));
            return;
        }

        /* Ignore writes to ROM.  */
        if (unlikely(tlb_addr & TLB_DISCARD_WRITE)) {
            return;
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two store_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            store_memop(haddr, val, op ^ MO_BSWAP);
        } else {
            store_memop(haddr, val, op);
        }
        return;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                     >= TARGET_PAGE_SIZE)) {
        int i;
        uintptr_t index2;
        CPUTLBEntry *entry2;
        target_ulong page2, tlb_addr2;
        size_t size2;
        int old_size;

    do_unaligned_access:
        /*
         * Ensure the second page is in the TLB.  Note that the first page
         * is already guaranteed to be filled, and that the second page
         * cannot evict the first.
         */
        page2 = (addr + size) & TARGET_PAGE_MASK;
        size2 = (addr + size) & ~TARGET_PAGE_MASK;
        index2 = tlb_index(env, mmu_idx, page2);
        entry2 = tlb_entry(env, mmu_idx, page2);
        tlb_addr2 = tlb_addr_write(entry2);
        if (!tlb_hit_page(uc, tlb_addr2, page2)) {
            if (!victim_tlb_hit(env, mmu_idx, index2, tlb_off, page2)) {
                tlb_fill(env_cpu(env), page2, size2, MMU_DATA_STORE,
                         mmu_idx, retaddr);
                index2 = tlb_index(env, mmu_idx, page2);
                entry2 = tlb_entry(env, mmu_idx, page2);
            }
            tlb_addr2 = tlb_addr_write(entry2);
        }

        /*
         * Handle watchpoints.  Since this may trap, all checks
         * must happen before any store.
         */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), addr, size - size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index].attrs,
                                 BP_MEM_WRITE, retaddr);
        }
        if (unlikely(tlb_addr2 & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), page2, size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index2].attrs,
                                 BP_MEM_WRITE, retaddr);
        }

        /*
         * XXX: not efficient, but simple.
         * This loop must go in the forward direction to avoid issues
         * with self-modifying code in Windows 64-bit.
         */
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        for (i = 0; i < size; ++i) {
            uint8_t val8;
            if (memop_big_endian(op)) {
                /* Big-endian extract.  */
                val8 = val >> (((size - 1) * 8) - (i * 8));
            } else {
                /* Little-endian extract.  */
                val8 = val >> (i * 8);
            }
            helper_ret_stb_mmu(env, addr + i, val8, oi, retaddr);
        }
        uc->size_recur_mem = old_size;
        return;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    store_memop(haddr, val, op);
}